

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O0

void * utf8rchr(void *src,int chr)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint in_ESI;
  char *in_RDI;
  size_t offset;
  char c [5];
  char *match;
  char *s;
  long local_38;
  byte local_2d [5];
  char *local_28;
  char *local_20;
  uint local_14;
  char *local_8;
  
  local_28 = (char *)0x0;
  local_20 = in_RDI;
  local_14 = in_ESI;
  memset(local_2d,0,5);
  if (local_14 == 0) {
    for (; *local_20 != '\0'; local_20 = local_20 + 1) {
    }
    local_8 = local_20;
  }
  else {
    bVar1 = (byte)local_14;
    if ((local_14 & 0xffffff80) == 0) {
      local_2d[0] = bVar1;
    }
    else {
      bVar2 = (byte)((int)local_14 >> 6);
      if ((local_14 & 0xfffff800) == 0) {
        local_2d[0] = bVar2 | 0xc0;
        local_2d[1] = bVar1 & 0x3f | 0x80;
      }
      else {
        bVar3 = (byte)((int)local_14 >> 0xc);
        if ((local_14 & 0xffff0000) == 0) {
          local_2d[0] = bVar3 | 0xe0;
          local_2d[1] = bVar2 & 0x3f | 0x80;
          local_2d[2] = bVar1 & 0x3f | 0x80;
        }
        else {
          local_2d[0] = (byte)((int)local_14 >> 0x12) | 0xf0;
          local_2d[1] = bVar3 & 0x3f | 0x80;
          local_2d[2] = bVar2 & 0x3f | 0x80;
          local_2d[3] = bVar1 & 0x3f | 0x80;
        }
      }
    }
    while (*local_20 != '\0') {
      for (local_38 = 0; local_20[local_38] == local_2d[local_38]; local_38 = local_38 + 1) {
      }
      if (local_2d[local_38] == 0) {
        local_28 = local_20;
        local_20 = local_20 + local_38;
      }
      else {
        local_20 = local_20 + local_38;
        if (*local_20 != '\0') {
          do {
            local_20 = local_20 + 1;
          } while (((int)*local_20 & 0xc0U) == 0x80);
        }
      }
    }
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

void *utf8rchr(const void *src, int chr) {
  const char *s = (const char *)src;
  const char *match = 0;
  char c[5] = {'\0', '\0', '\0', '\0', '\0'};

  if (0 == chr) {
    // being asked to return position of null terminating byte, so
    // just run s to the end, and return!
    while ('\0' != *s) {
      s++;
    }
    return (void *)s;
  } else if (0 == ((int)0xffffff80 & chr)) {
    // 1-byte/7-bit ascii
    // (0b0xxxxxxx)
    c[0] = (char)chr;
  } else if (0 == ((int)0xfffff800 & chr)) {
    // 2-byte/11-bit utf8 code point
    // (0b110xxxxx 0b10xxxxxx)
    c[0] = 0xc0 | (char)(chr >> 6);
    c[1] = 0x80 | (char)(chr & 0x3f);
  } else if (0 == ((int)0xffff0000 & chr)) {
    // 3-byte/16-bit utf8 code point
    // (0b1110xxxx 0b10xxxxxx 0b10xxxxxx)
    c[0] = 0xe0 | (char)(chr >> 12);
    c[1] = 0x80 | (char)((chr >> 6) & 0x3f);
    c[2] = 0x80 | (char)(chr & 0x3f);
  } else { // if (0 == ((int)0xffe00000 & chr)) {
    // 4-byte/21-bit utf8 code point
    // (0b11110xxx 0b10xxxxxx 0b10xxxxxx 0b10xxxxxx)
    c[0] = 0xf0 | (char)(chr >> 18);
    c[1] = 0x80 | (char)((chr >> 12) & 0x3f);
    c[2] = 0x80 | (char)((chr >> 6) & 0x3f);
    c[3] = 0x80 | (char)(chr & 0x3f);
  }

  // we've created a 2 utf8 codepoint string in c that is
  // the utf8 character asked for by chr, and a null
  // terminating byte

  while ('\0' != *s) {
    size_t offset = 0;

    while (s[offset] == c[offset]) {
      offset++;
    }

    if ('\0' == c[offset]) {
      // we found a matching utf8 code point
      match = s;
      s += offset;
    } else {
      s += offset;

      // need to march s along to next utf8 codepoint start
      // (the next byte that doesn't match 0b10xxxxxx)
      if ('\0' != *s) {
        do {
          s++;
        } while (0x80 == (0xc0 & *s));
      }
    }
  }

  // return the last match we found (or 0 if no match was found)
  return (void *)match;
}